

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core,char *name,HelicsError *err)

{
  long *plVar1;
  undefined1 auVar2 [16];
  string_view name_00;
  long *plVar3;
  HelicsFilter pvVar4;
  allocator<char> local_a1;
  __single_object filt;
  long *local_98;
  unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_> local_90;
  shared_ptr<helics::Core> corePtr;
  char *local_78;
  size_t local_70;
  size_t local_58;
  char *pcStack_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  getCoreSharedPtr(&corePtr,(HelicsError *)core);
  if (corePtr.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pvVar4 = (HelicsFilter)0x0;
  }
  else {
    std::make_unique<helics::FilterObject>();
    local_40 = 0;
    local_38[0] = 0;
    local_48 = local_38;
    if (name == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_78,&gHelicsEmptyStr_abi_cxx11_);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,name,&local_a1);
    }
    local_58 = local_70;
    pcStack_50 = local_78;
    name_00._M_str = local_78;
    name_00._M_len = local_70;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_38;
    helics::make_cloning_filter
              ((helics *)&local_98,CLONE,
               corePtr.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string_view)(auVar2 << 0x40),name_00);
    plVar3 = local_98;
    local_98 = (long *)0x0;
    plVar1 = *(long **)((long)filt._M_t.
                              super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                              .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl +
                       0x10);
    *(long **)((long)filt._M_t.
                     super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                     .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 0x10) =
         plVar3;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
      if (local_98 != (long *)0x0) {
        (**(code **)(*local_98 + 8))();
      }
    }
    local_98 = (long *)0x0;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
    *(undefined8 *)
     ((long)filt._M_t.
            super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
            _M_t.
            super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
            .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 8) =
         *(undefined8 *)
          ((long)filt._M_t.
                 super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                 .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 0x10);
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)filt._M_t.
                      super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>
                      .super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl + 0x28),
               &corePtr.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>);
    *(undefined1 *)
     filt._M_t.
     super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
     super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
     super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl = 1;
    local_90._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         filt._M_t.
         super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>.
         _M_t.
         super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
         super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl;
    filt._M_t.
    super___uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>._M_t.
    super__Tuple_impl<0UL,_helics::FilterObject_*,_std::default_delete<helics::FilterObject>_>.
    super__Head_base<0UL,_helics::FilterObject_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::FilterObject,_std::default_delete<helics::FilterObject>,_true,_true>
          )(__uniq_ptr_impl<helics::FilterObject,_std::default_delete<helics::FilterObject>_>)0x0;
    pvVar4 = anon_unknown.dwarf_a089a::coreAddFilter(core,&local_90);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&local_90);
    std::unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>::~unique_ptr
              (&filt);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&corePtr.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return pvVar4;
}

Assistant:

HelicsFilter helicsCoreRegisterCloningFilter(HelicsCore core, const char* name, HelicsError* err)
{
    auto corePtr = getCoreSharedPtr(core, err);
    if (!corePtr) {
        return nullptr;
    }
    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->uFilter = helics::make_cloning_filter(helics::FilterTypes::CLONE, corePtr.get(), std::string{}, AS_STRING(name));
        filt->filtPtr = filt->uFilter.get();
        filt->corePtr = std::move(corePtr);
        filt->cloning = true;
        return coreAddFilter(core, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}